

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

int __thiscall asl::Random::init(Random *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int extraout_EAX_00;
  ulong s;
  long lVar1;
  byte bVar2;
  int i;
  
  if ((int)ctx != 0) {
    bVar2 = 0;
    s = inow();
    for (lVar1 = 0x38; lVar1 != -8; lVar1 = lVar1 + -0x10) {
      s = s ^ (~s & 0xffL << (bVar2 & 0x3f)) << ((byte)lVar1 & 0x3f);
      bVar2 = bVar2 + 1;
    }
    seed(this,s);
    return extraout_EAX_00;
  }
  getBytes(this,0x20);
  return extraout_EAX;
}

Assistant:

void Random::init(bool fast)
{
	if (fast)
	{
		ULong s = (ULong)inow();
		for (int i = 0; i < (int)sizeof(s)/2; i++)
			s ^= ((s & (255ull << i)) ^ (255ull << i)) << 8 * (sizeof(s) - i - i - 1);
		seed(s);
	}
	else
		getBytes(_state, sizeof(_state));
}